

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

word * Ifn_NtkDeriveTruth(Ifn_Ntk_t *p,int *pValues)

{
  word *__s;
  size_t __n;
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int *piVar10;
  int iVar11;
  word *pwVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  word *__s_00;
  
  uVar9 = p->nInps;
  lVar17 = (long)(int)uVar9;
  if (0 < lVar17) {
    uVar4 = p->nParsVNum;
    pwVar12 = p->pTtObjs;
    uVar14 = p->nWords;
    lVar15 = 0;
    bVar3 = (char)uVar9 - 6;
    if (uVar9 < 7) {
      bVar3 = 0;
    }
    piVar10 = p->Values + p->nParsVIni;
    do {
      iVar11 = 0;
      if (0 < (int)uVar4) {
        uVar6 = 0;
        iVar11 = 0;
        do {
          iVar18 = 1 << ((byte)uVar6 & 0x1f);
          if (piVar10[uVar6] == 0) {
            iVar18 = 0;
          }
          iVar11 = iVar11 + iVar18;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      if (0 < (int)uVar14) {
        uVar6 = 0;
        do {
          pwVar12[uVar6] = p->pTtElems[(long)(iVar11 << (bVar3 & 0x1f)) + uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar14 != uVar6);
      }
      lVar15 = lVar15 + 1;
      piVar10 = piVar10 + (int)uVar4;
      pwVar12 = pwVar12 + (int)uVar14;
    } while (lVar15 != lVar17);
  }
  iVar11 = p->nObjs;
  if ((int)uVar9 < iVar11) {
    uVar9 = p->nWords;
    uVar6 = (ulong)uVar9;
    __s_00 = p->pTtObjs + (int)(uVar9 * iVar11);
    __n = uVar6 * 8;
    lVar15 = (long)(int)uVar9;
    pwVar12 = p->pTtObjs + lVar17 * lVar15;
    do {
      uVar4 = *(uint *)(p->Nodes + lVar17) & 7;
      if (3 < uVar4 - 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x3c1,"word *Ifn_NtkDeriveTruth(Ifn_Ntk_t *, int *)");
      }
      uVar14 = *(uint *)(p->Nodes + lVar17) >> 3 & 0x1f;
      uVar13 = (ulong)uVar14;
      __s = p->pTtObjs + lVar17 * lVar15;
      switch(uVar4) {
      case 3:
        if (0 < (int)uVar9) {
          memset(__s,0xff,__n);
        }
        if (uVar14 != 0) {
          uVar5 = 0;
          do {
            if (0 < (int)uVar9) {
              iVar18 = p->Nodes[lVar17].Fanins[uVar5];
              uVar8 = 0;
              do {
                pwVar12[uVar8] = pwVar12[uVar8] & p->pTtObjs[(long)(int)(iVar18 * uVar9) + uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar6 != uVar8);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar13);
        }
        break;
      case 4:
        if (0 < (int)uVar9) {
          memset(__s,0,__n);
        }
        if (uVar14 != 0) {
          uVar5 = 0;
          do {
            if (0 < (int)uVar9) {
              iVar18 = p->Nodes[lVar17].Fanins[uVar5];
              uVar8 = 0;
              do {
                pwVar12[uVar8] = pwVar12[uVar8] ^ p->pTtObjs[(long)(int)(iVar18 * uVar9) + uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar6 != uVar8);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar13);
        }
        break;
      case 5:
        if (uVar14 != 3) {
          __assert_fail("nFans == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                        ,0x3ac,"word *Ifn_NtkDeriveTruth(Ifn_Ntk_t *, int *)");
        }
        if (0 < (int)uVar9) {
          iVar18 = p->Nodes[lVar17].Fanins[0];
          iVar1 = p->Nodes[lVar17].Fanins[1];
          iVar2 = p->Nodes[lVar17].Fanins[2];
          uVar13 = 0;
          do {
            pwVar12[uVar13] =
                 (p->pTtObjs[(long)(int)(iVar1 * uVar9) + uVar13] ^
                 p->pTtObjs[(long)(int)(iVar2 * uVar9) + uVar13]) &
                 p->pTtObjs[(long)(int)(iVar18 * uVar9) + uVar13] ^
                 p->pTtObjs[(long)(int)(iVar2 * uVar9) + uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar6 != uVar13);
        }
        break;
      case 6:
        uVar4 = 1 << (sbyte)uVar14;
        if (0 < (int)uVar9) {
          memset(__s,0,__n);
        }
        if (uVar14 != 0x1f) {
          if ((int)uVar4 < 2) {
            uVar4 = 1;
          }
          uVar16 = 0;
          do {
            if (pValues[(byte)p->Nodes[lVar17].field_0x1 + uVar16] != 0) {
              if (0 < (int)uVar9) {
                memset(__s_00,0xff,__n);
              }
              if (uVar14 != 0) {
                uVar5 = 0;
                do {
                  lVar7 = (long)(int)(p->Nodes[lVar17].Fanins[uVar5] * uVar9);
                  if ((uVar16 >> ((uint)uVar5 & 0x1f) & 1) == 0) {
                    if (0 < (int)uVar9) {
                      uVar8 = 0;
                      do {
                        __s_00[uVar8] = __s_00[uVar8] & ~p->pTtObjs[lVar7 + uVar8];
                        uVar8 = uVar8 + 1;
                      } while (uVar6 != uVar8);
                    }
                  }
                  else if (0 < (int)uVar9) {
                    uVar8 = 0;
                    do {
                      __s_00[uVar8] = __s_00[uVar8] & p->pTtObjs[lVar7 + uVar8];
                      uVar8 = uVar8 + 1;
                    } while (uVar6 != uVar8);
                  }
                  uVar5 = uVar5 + 1;
                } while (uVar5 != uVar13);
              }
              if (0 < (int)uVar9) {
                uVar5 = 0;
                do {
                  pwVar12[uVar5] = pwVar12[uVar5] | __s_00[uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar6 != uVar5);
              }
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar4);
        }
      }
      lVar17 = lVar17 + 1;
      pwVar12 = pwVar12 + lVar15;
    } while (iVar11 != (int)lVar17);
  }
  else {
    uVar9 = p->nWords;
  }
  return p->pTtObjs + (int)((iVar11 + -1) * uVar9);
}

Assistant:

word * Ifn_NtkDeriveTruth( Ifn_Ntk_t * p, int * pValues )
{
    int i, v, f, iVar, iStart;
    // elementary variables
    for ( i = 0; i < p->nInps; i++ )
    {
        // find variable
        iStart = p->nParsVIni + i * p->nParsVNum;
        for ( v = iVar = 0; v < p->nParsVNum; v++ )
            if ( p->Values[iStart+v] )
                iVar += (1 << v);
        // assign variable
        Abc_TtCopy( Ifn_ObjTruth(p, i), Ifn_ElemTruth(p, iVar), p->nWords, 0 );
    }
    // internal variables
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        word * pTruth = Ifn_ObjTruth( p, i );
        if ( p->Nodes[i].Type == IFN_DSD_AND )
        {
            Abc_TtFill( pTruth, p->nWords );
            for ( f = 0; f < nFans; f++ )
                Abc_TtAnd( pTruth, pTruth, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_XOR )
        {
            Abc_TtClear( pTruth, p->nWords );
            for ( f = 0; f < nFans; f++ )
                Abc_TtXor( pTruth, pTruth, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            Abc_TtMux( pTruth, Ifn_ObjTruth(p, pFans[0]), Ifn_ObjTruth(p, pFans[1]), Ifn_ObjTruth(p, pFans[2]), p->nWords );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_PRIME )
        {
            int nValues = (1 << nFans);
            word * pTemp = Ifn_ObjTruth(p, p->nObjs);
            Abc_TtClear( pTruth, p->nWords );
            for ( v = 0; v < nValues; v++ )
            {
                if ( pValues[p->Nodes[i].iFirst + v] == 0 )
                    continue;
                Abc_TtFill( pTemp, p->nWords );
                for ( f = 0; f < nFans; f++ )
                    if ( (v >> f) & 1 )
                        Abc_TtAnd( pTemp, pTemp, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
                    else
                        Abc_TtSharp( pTemp, pTemp, Ifn_ObjTruth(p, pFans[f]), p->nWords );
                Abc_TtOr( pTruth, pTruth, pTemp, p->nWords );
            }
        }
        else assert( 0 );
//Dau_DsdPrintFromTruth( pTruth, p->nVars );
    }
    return Ifn_ObjTruth(p, p->nObjs-1);
}